

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O2

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
closest_gap(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
            *this,int pos)

{
  int iVar1;
  ulong *puVar2;
  uint64_t *puVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  ulong *puVar16;
  uint uVar17;
  long lVar18;
  
  iVar12 = this->data_capacity_;
  puVar3 = this->bitmap_;
  uVar5 = iVar12 - 1;
  if ((int)uVar5 < pos) {
    pos = uVar5;
  }
  iVar10 = pos >> 6;
  uVar17 = pos & 0x3f;
  lVar18 = (long)iVar10;
  uVar7 = puVar3[lVar18];
  if ((uVar7 == 0xffffffffffffffff) ||
     ((iVar6 = this->bitmap_size_, iVar10 == iVar6 + -1 &&
      (POPCOUNT(uVar7) == (long)(iVar12 + iVar6 * -0x40 + 0x40))))) {
    iVar11 = ((int)uVar5 >> 6) - iVar10;
    iVar6 = iVar10;
    if (iVar11 < iVar10) {
      iVar6 = iVar11;
    }
    iVar14 = iVar10 * 0x40;
    iVar15 = 0;
    puVar2 = puVar3 + lVar18 + -1;
    iVar1 = iVar14 + 0x40;
    uVar7 = 0;
    puVar16 = puVar2;
    while( true ) {
      if ((long)iVar6 < (long)(uVar7 + 1)) break;
      uVar9 = puVar2[uVar7 + 2];
      uVar4 = *puVar16;
      uVar13 = ~uVar9;
      if ((uVar4 != 0xffffffffffffffff) && (uVar9 != 0xffffffffffffffff)) {
        iVar6 = 0;
        for (; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
          iVar6 = iVar6 + 1;
        }
        iVar11 = iVar15 + 0x40 + iVar6 + iVar14;
        iVar8 = ((iVar1 - (int)LZCOUNT(~uVar4)) - iVar15) + -0x41;
        iVar1 = iVar8;
        if (iVar15 + 0x40 + (iVar14 - pos) + iVar6 <
            iVar15 + 1 + pos + iVar10 * -0x40 + (int)LZCOUNT(~uVar4)) {
          iVar1 = iVar11;
        }
        if (iVar11 < iVar12) {
          return iVar1;
        }
        return iVar8;
      }
      if (uVar4 != 0xffffffffffffffff) {
        iVar6 = ((iVar1 - (int)LZCOUNT(~uVar4)) - iVar15) + -0x41;
        if (uVar17 < 0x21) {
          return iVar6;
        }
        if (this->bitmap_size_ <= (int)(iVar10 + 2 + (uint)uVar7)) {
          return iVar6;
        }
        if (puVar2[uVar7 + 3] == 0xffffffffffffffff) {
          return iVar6;
        }
        iVar11 = 0;
        for (uVar7 = ~puVar2[uVar7 + 3]; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x8000000000000000)
        {
          iVar11 = iVar11 + 1;
        }
        iVar8 = iVar14 + iVar15 + 0x80 + iVar11;
        iVar1 = iVar6;
        if ((iVar14 - pos) + iVar15 + 0x80 + iVar11 <
            iVar15 + 1 + (int)LZCOUNT(~uVar4) + pos + iVar10 * -0x40) {
          iVar1 = iVar8;
        }
        if (iVar12 <= iVar8) {
          return iVar6;
        }
        return iVar1;
      }
      if (uVar9 != 0xffffffffffffffff) {
        iVar8 = 0;
        for (; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
          iVar8 = iVar8 + 1;
        }
        if (iVar8 + 0x40 + iVar14 + iVar15 < iVar12) {
          iVar12 = iVar15 + 0x40 + iVar8 + iVar14;
          if (0x1f < uVar17) {
            return iVar12;
          }
          if ((long)(~uVar7 + lVar18) < 1) {
            return iVar12;
          }
          if (puVar3[(~uVar7 + lVar18 & 0xffffffff) - 1] == 0xffffffffffffffff) {
            return iVar12;
          }
          iVar6 = (int)LZCOUNT(~puVar3[(~uVar7 + lVar18 & 0xffffffff) - 1]);
          if (iVar15 + 0x40 + (iVar14 - pos) + iVar8 < iVar15 + 0x41 + pos + iVar10 * -0x40 + iVar6)
          {
            return iVar12;
          }
          return ((iVar1 - iVar6) - iVar15) + -0x81;
        }
      }
      iVar15 = iVar15 + 0x40;
      puVar16 = puVar16 + -1;
      uVar7 = uVar7 + 1;
    }
    if (iVar11 < iVar10) {
      iVar12 = (iVar1 - iVar15) + -0x41;
      for (uVar5 = ~(uint)uVar7 + iVar10; iVar10 = -1, -1 < (int)uVar5; uVar5 = uVar5 - 1) {
        if (puVar3[uVar5] != 0xffffffffffffffff) {
          return iVar12 - (int)LZCOUNT(~puVar3[uVar5]);
        }
        iVar12 = iVar12 + -0x40;
      }
    }
    else {
      iVar15 = iVar14 + 0x40 + iVar15;
      for (lVar18 = lVar18 + 1 + uVar7; iVar10 = -1, lVar18 <= (int)uVar5 >> 6; lVar18 = lVar18 + 1)
      {
        if (puVar3[lVar18] != 0xffffffffffffffff) {
          iVar10 = 0;
          for (uVar7 = ~puVar3[lVar18]; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x8000000000000000) {
            iVar10 = iVar10 + 1;
          }
          if (iVar12 <= iVar10 + iVar15) {
            return -1;
          }
          return iVar10 + iVar15;
        }
        iVar15 = iVar15 + 0x40;
      }
    }
  }
  else {
    uVar9 = ~uVar7 & -1L << (ulong)uVar17;
    if (uVar9 == 0) {
      if (iVar10 + 1 < iVar6) {
        iVar6 = 0;
        for (uVar9 = ~puVar3[iVar10 + 1]; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000)
        {
          iVar6 = iVar6 + 1;
        }
        iVar6 = (iVar6 - uVar17) + 0x40;
      }
      else {
        iVar6 = 0x40;
      }
    }
    else {
      iVar6 = 0;
      for (; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000) {
        iVar6 = iVar6 + 1;
      }
      iVar6 = iVar6 - uVar17;
    }
    uVar7 = -1L << (ulong)uVar17 | uVar7;
    if (uVar7 == 0xffffffffffffffff) {
      if (iVar10 < 1) {
        iVar11 = 0x40;
      }
      else {
        iVar11 = uVar17 + 1 + (int)LZCOUNT(~puVar3[lVar18 + -1]);
      }
    }
    else {
      iVar11 = (uVar17 - 0x3f) + (int)LZCOUNT(~uVar7);
    }
    iVar10 = iVar6 + pos;
    if (iVar12 <= iVar6 + pos) {
      iVar10 = pos - iVar11;
    }
    if (iVar11 <= iVar6) {
      iVar10 = pos - iVar11;
    }
  }
  return iVar10;
}

Assistant:

int closest_gap(int pos) const {
    pos = std::min(pos, data_capacity_ - 1);
    int bitmap_pos = pos >> 6;
    int bit_pos = pos - (bitmap_pos << 6);
    if (bitmap_[bitmap_pos] == static_cast<uint64_t>(-1) ||
        (bitmap_pos == bitmap_size_ - 1 &&
         _mm_popcnt_u64(bitmap_[bitmap_pos]) ==
             data_capacity_ - ((bitmap_size_ - 1) << 6))) {
      // no gaps in this block of 64 positions, start searching in adjacent
      // blocks
      int left_bitmap_pos = 0;
      int right_bitmap_pos = ((data_capacity_ - 1) >> 6);  // inclusive
      int max_left_bitmap_offset = bitmap_pos - left_bitmap_pos;
      int max_right_bitmap_offset = right_bitmap_pos - bitmap_pos;
      int max_bidirectional_bitmap_offset =
          std::min<int>(max_left_bitmap_offset, max_right_bitmap_offset);
      int bitmap_distance = 1;
      while (bitmap_distance <= max_bidirectional_bitmap_offset) {
        uint64_t left_bitmap_data = bitmap_[bitmap_pos - bitmap_distance];
        uint64_t right_bitmap_data = bitmap_[bitmap_pos + bitmap_distance];
        if (left_bitmap_data != static_cast<uint64_t>(-1) &&
            right_bitmap_data != static_cast<uint64_t>(-1)) {
          int left_gap_pos = ((bitmap_pos - bitmap_distance + 1) << 6) -
                             static_cast<int>(_lzcnt_u64(~left_bitmap_data)) -
                             1;
          int right_gap_pos = ((bitmap_pos + bitmap_distance) << 6) +
                              static_cast<int>(_tzcnt_u64(~right_bitmap_data));
          if (pos - left_gap_pos <= right_gap_pos - pos ||
              right_gap_pos >= data_capacity_) {
            return left_gap_pos;
          } else {
            return right_gap_pos;
          }
        } else if (left_bitmap_data != static_cast<uint64_t>(-1)) {
          int left_gap_pos = ((bitmap_pos - bitmap_distance + 1) << 6) -
                             static_cast<int>(_lzcnt_u64(~left_bitmap_data)) -
                             1;
          // also need to check next block to the right
          if (bit_pos > 32 && bitmap_pos + bitmap_distance + 1 < bitmap_size_ &&
              bitmap_[bitmap_pos + bitmap_distance + 1] !=
                  static_cast<uint64_t>(-1)) {
            int right_gap_pos =
                ((bitmap_pos + bitmap_distance + 1) << 6) +
                static_cast<int>(
                    _tzcnt_u64(~bitmap_[bitmap_pos + bitmap_distance + 1]));
            if (pos - left_gap_pos <= right_gap_pos - pos ||
                right_gap_pos >= data_capacity_) {
              return left_gap_pos;
            } else {
              return right_gap_pos;
            }
          } else {
            return left_gap_pos;
          }
        } else if (right_bitmap_data != static_cast<uint64_t>(-1)) {
          int right_gap_pos = ((bitmap_pos + bitmap_distance) << 6) +
                              static_cast<int>(_tzcnt_u64(~right_bitmap_data));
          if (right_gap_pos < data_capacity_) {
            // also need to check next block to the left
            if (bit_pos < 32 && bitmap_pos - bitmap_distance > 0 &&
                bitmap_[bitmap_pos - bitmap_distance - 1] !=
                    static_cast<uint64_t>(-1)) {
              int left_gap_pos =
                  ((bitmap_pos - bitmap_distance) << 6) -
                  static_cast<int>(
                      _lzcnt_u64(~bitmap_[bitmap_pos - bitmap_distance - 1])) -
                  1;
              if (pos - left_gap_pos <= right_gap_pos - pos ||
                  right_gap_pos >= data_capacity_) {
                return left_gap_pos;
              } else {
                return right_gap_pos;
              }
            } else {
              return right_gap_pos;
            }
          }
        }
        bitmap_distance++;
      }
      if (max_left_bitmap_offset > max_right_bitmap_offset) {
        for (int i = bitmap_pos - bitmap_distance; i >= left_bitmap_pos; i--) {
          if (bitmap_[i] != static_cast<uint64_t>(-1)) {
            return ((i + 1) << 6) - static_cast<int>(_lzcnt_u64(~bitmap_[i])) -
                   1;
          }
        }
      } else {
        for (int i = bitmap_pos + bitmap_distance; i <= right_bitmap_pos; i++) {
          if (bitmap_[i] != static_cast<uint64_t>(-1)) {
            int right_gap_pos =
                (i << 6) + static_cast<int>(_tzcnt_u64(~bitmap_[i]));
            if (right_gap_pos >= data_capacity_) {
              return -1;
            } else {
              return right_gap_pos;
            }
          }
        }
      }
      return -1;
    } else {
      // search within block of 64 positions
      uint64_t bitmap_data = bitmap_[bitmap_pos];
      int closest_right_gap_distance = 64;
      int closest_left_gap_distance = 64;
      // Logically gaps to the right of pos, in the bitmap these are gaps to the
      // left of pos's bit
      // This covers the case where pos is a gap
      // For example, if pos is 3, then bitmap '10101101' -> bitmap_right_gaps
      // '01010000'
      uint64_t bitmap_right_gaps = ~(bitmap_data | ((1ULL << bit_pos) - 1));
      if (bitmap_right_gaps != 0) {
        closest_right_gap_distance =
            static_cast<int>(_tzcnt_u64(bitmap_right_gaps)) - bit_pos;
      } else if (bitmap_pos + 1 < bitmap_size_) {
        // look in the next block to the right
        closest_right_gap_distance =
            64 + static_cast<int>(_tzcnt_u64(~bitmap_[bitmap_pos + 1])) -
            bit_pos;
      }
      // Logically gaps to the left of pos, in the bitmap these are gaps to the
      // right of pos's bit
      // For example, if pos is 3, then bitmap '10101101' -> bitmap_left_gaps
      // '00000010'
      uint64_t bitmap_left_gaps = (~bitmap_data) & ((1ULL << bit_pos) - 1);
      if (bitmap_left_gaps != 0) {
        closest_left_gap_distance =
            bit_pos - (63 - static_cast<int>(_lzcnt_u64(bitmap_left_gaps)));
      } else if (bitmap_pos > 0) {
        // look in the next block to the left
        closest_left_gap_distance =
            bit_pos + static_cast<int>(_lzcnt_u64(~bitmap_[bitmap_pos - 1])) +
            1;
      }

      if (closest_right_gap_distance < closest_left_gap_distance &&
          pos + closest_right_gap_distance < data_capacity_) {
        return pos + closest_right_gap_distance;
      } else {
        return pos - closest_left_gap_distance;
      }
    }
  }